

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

long kwssys::SystemTools::ModifiedTime(string *filename)

{
  int iVar1;
  char *__file;
  stat fs;
  long mt;
  stat local_a0;
  long local_10;
  
  local_10 = 0;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,&local_a0);
  if (iVar1 == 0) {
    local_10 = local_a0.st_mtim.tv_sec;
  }
  return local_10;
}

Assistant:

long int SystemTools::ModifiedTime(const std::string& filename)
{
  long int mt = 0;
#ifdef _WIN32
  WIN32_FILE_ATTRIBUTE_DATA fs;
  if (GetFileAttributesExW(Encoding::ToWindowsExtendedPath(filename).c_str(),
                           GetFileExInfoStandard, &fs) != 0) {
    mt = windows_filetime_to_posix_time(fs.ftLastWriteTime);
  }
#else
  struct stat fs;
  if (stat(filename.c_str(), &fs) == 0) {
    mt = static_cast<long int>(fs.st_mtime);
  }
#endif
  return mt;
}